

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# bfgs.cc
# Opt level: O0

void finalize_preconditioner<sparse_parameters>
               (vw *param_1,bfgs *b,float regularization,sparse_parameters *weights)

{
  float fVar1;
  long lVar2;
  bool bVar3;
  uint32_t uVar4;
  char *pcVar5;
  float *pfVar6;
  int __c;
  sparse_parameters *in_RDX;
  long in_RSI;
  _Node_iterator_base<std::pair<const_unsigned_long,_float_*>,_false> *__s;
  float in_XMM0_Da;
  iterator iVar7;
  iterator w_2;
  float max_precond;
  iterator w_1;
  iterator w;
  float max_hessian;
  sparse_iterator<float> *in_stack_fffffffffffffed8;
  undefined4 in_stack_fffffffffffffee0;
  float in_stack_fffffffffffffee4;
  float local_118;
  _Node_iterator_base<std::pair<const_unsigned_long,_float_*>,_false> local_98;
  uint32_t local_90;
  _Node_iterator_base<std::pair<const_unsigned_long,_float_*>,_false> local_88;
  uint32_t local_80;
  sparse_iterator<float> local_78;
  _Node_iterator_base<std::pair<const_unsigned_long,_float_*>,_false> local_68;
  uint32_t local_60;
  _Node_iterator_base<std::pair<const_unsigned_long,_float_*>,_false> local_58;
  uint32_t local_50;
  _Node_iterator_base<std::pair<const_unsigned_long,_float_*>,_false> local_48;
  uint32_t local_40;
  _Node_iterator_base<std::pair<const_unsigned_long,_float_*>,_false> local_38;
  uint32_t local_30;
  float local_24;
  sparse_parameters *local_20;
  float local_14;
  long local_10;
  
  local_24 = 0.0;
  if (*(long *)(in_RSI + 0xd8) == 0) {
    local_14 = in_XMM0_Da;
    iVar7 = sparse_parameters::begin
                      ((sparse_parameters *)
                       CONCAT44(in_stack_fffffffffffffee4,in_stack_fffffffffffffee0));
    local_48._M_cur =
         (__node_type *)
         iVar7._iter.super__Node_iterator_base<std::pair<const_unsigned_long,_float_*>,_false>.
         _M_cur;
    local_40 = iVar7._stride;
    local_38._M_cur = local_48._M_cur;
    local_30 = local_40;
    while( true ) {
      iVar7 = sparse_parameters::end
                        ((sparse_parameters *)
                         CONCAT44(in_stack_fffffffffffffee4,in_stack_fffffffffffffee0));
      local_68._M_cur =
           (__node_type *)
           iVar7._iter.super__Node_iterator_base<std::pair<const_unsigned_long,_float_*>,_false>.
           _M_cur;
      local_60 = iVar7._stride;
      local_58._M_cur = local_68._M_cur;
      local_50 = local_60;
      bVar3 = sparse_iterator<float>::operator!=
                        ((sparse_iterator<float> *)
                         CONCAT44(in_stack_fffffffffffffee4,in_stack_fffffffffffffee0),
                         in_stack_fffffffffffffed8);
      fVar1 = local_14;
      if (!bVar3) break;
      pfVar6 = sparse_iterator<float>::operator*((sparse_iterator<float> *)0x24e328);
      pfVar6[3] = fVar1 + pfVar6[3];
      pfVar6 = sparse_iterator<float>::operator*((sparse_iterator<float> *)0x24e345);
      if (local_24 < pfVar6[3]) {
        pfVar6 = sparse_iterator<float>::operator*((sparse_iterator<float> *)0x24e361);
        local_24 = pfVar6[3];
      }
      pfVar6 = sparse_iterator<float>::operator*((sparse_iterator<float> *)0x24e37c);
      if (0.0 < pfVar6[3]) {
        pfVar6 = sparse_iterator<float>::operator*((sparse_iterator<float> *)0x24e396);
        fVar1 = pfVar6[3];
        pfVar6 = sparse_iterator<float>::operator*((sparse_iterator<float> *)0x24e3b6);
        pfVar6[3] = 1.0 / fVar1;
      }
      sparse_iterator<float>::operator++
                ((sparse_iterator<float> *)
                 CONCAT44(in_stack_fffffffffffffee4,in_stack_fffffffffffffee0));
    }
  }
  else {
    local_20 = in_RDX;
    local_10 = in_RSI;
    iVar7 = sparse_parameters::begin
                      ((sparse_parameters *)
                       CONCAT44(in_stack_fffffffffffffee4,in_stack_fffffffffffffee0));
    local_88._M_cur =
         (__node_type *)
         iVar7._iter.super__Node_iterator_base<std::pair<const_unsigned_long,_float_*>,_false>.
         _M_cur;
    local_80 = iVar7._stride;
    local_78._iter.super__Node_iterator_base<std::pair<const_unsigned_long,_float_*>,_false>._M_cur
         = (_Node_iterator_base<std::pair<const_unsigned_long,_float_*>,_false>)
           (_Node_iterator_base<std::pair<const_unsigned_long,_float_*>,_false>)local_88._M_cur;
    local_78._stride = local_80;
    while( true ) {
      iVar7 = sparse_parameters::end
                        ((sparse_parameters *)
                         CONCAT44(in_stack_fffffffffffffee4,in_stack_fffffffffffffee0));
      local_98._M_cur =
           (__node_type *)
           iVar7._iter.super__Node_iterator_base<std::pair<const_unsigned_long,_float_*>,_false>.
           _M_cur;
      local_90 = iVar7._stride;
      __s = &local_98;
      bVar3 = sparse_iterator<float>::operator!=
                        ((sparse_iterator<float> *)
                         CONCAT44(in_stack_fffffffffffffee4,in_stack_fffffffffffffee0),
                         in_stack_fffffffffffffed8);
      if (!bVar3) break;
      lVar2 = *(long *)(local_10 + 0xd8);
      pcVar5 = sparse_iterator<float>::index(&local_78,(char *)__s,__c);
      uVar4 = sparse_parameters::stride_shift(local_20);
      fVar1 = *(float *)(lVar2 + ((ulong)pcVar5 >> ((byte)uVar4 & 0x3f)) * 8);
      pfVar6 = sparse_iterator<float>::operator*((sparse_iterator<float> *)0x24e4ce);
      pfVar6[3] = fVar1 + pfVar6[3];
      pfVar6 = sparse_iterator<float>::operator*((sparse_iterator<float> *)0x24e4eb);
      if (local_24 < pfVar6[3]) {
        pfVar6 = sparse_iterator<float>::operator*((sparse_iterator<float> *)0x24e507);
        local_24 = pfVar6[3];
      }
      pfVar6 = sparse_iterator<float>::operator*((sparse_iterator<float> *)0x24e522);
      if (0.0 < pfVar6[3]) {
        pfVar6 = sparse_iterator<float>::operator*((sparse_iterator<float> *)0x24e53c);
        fVar1 = pfVar6[3];
        pfVar6 = sparse_iterator<float>::operator*((sparse_iterator<float> *)0x24e55c);
        pfVar6[3] = 1.0 / fVar1;
      }
      sparse_iterator<float>::operator++
                ((sparse_iterator<float> *)
                 CONCAT44(in_stack_fffffffffffffee4,in_stack_fffffffffffffee0));
    }
  }
  if ((local_24 != 0.0) || (NAN(local_24))) {
    local_118 = 10000.0 / local_24;
  }
  else {
    local_118 = 0.0;
  }
  sparse_parameters::begin
            ((sparse_parameters *)CONCAT44(in_stack_fffffffffffffee4,in_stack_fffffffffffffee0));
  while( true ) {
    sparse_parameters::end
              ((sparse_parameters *)CONCAT44(in_stack_fffffffffffffee4,in_stack_fffffffffffffee0));
    bVar3 = sparse_iterator<float>::operator!=
                      ((sparse_iterator<float> *)
                       CONCAT44(in_stack_fffffffffffffee4,in_stack_fffffffffffffee0),
                       in_stack_fffffffffffffed8);
    if (!bVar3) break;
    sparse_iterator<float>::operator*((sparse_iterator<float> *)0x24e62d);
    bVar3 = infpattern(0.0);
    if ((bVar3) ||
       (pfVar6 = sparse_iterator<float>::operator*((sparse_iterator<float> *)0x24e644),
       local_118 < *pfVar6)) {
      in_stack_fffffffffffffee4 = local_118;
      pfVar6 = sparse_iterator<float>::operator*((sparse_iterator<float> *)0x24e665);
      pfVar6[3] = in_stack_fffffffffffffee4;
    }
    sparse_iterator<float>::operator++
              ((sparse_iterator<float> *)
               CONCAT44(in_stack_fffffffffffffee4,in_stack_fffffffffffffee0));
  }
  return;
}

Assistant:

void finalize_preconditioner(vw& /* all */, bfgs& b, float regularization, T& weights)
{
  float max_hessian = 0.f;

  if (b.regularizers == nullptr)
    for (typename T::iterator w = weights.begin(); w != weights.end(); ++w)
    {
      (&(*w))[W_COND] += regularization;
      if ((&(*w))[W_COND] > max_hessian)
        max_hessian = (&(*w))[W_COND];
      if ((&(*w))[W_COND] > 0)
        (&(*w))[W_COND] = 1.f / (&(*w))[W_COND];
    }
  else
    for (typename T::iterator w = weights.begin(); w != weights.end(); ++w)
    {
      (&(*w))[W_COND] += b.regularizers[2 * (w.index() >> weights.stride_shift())];
      if ((&(*w))[W_COND] > max_hessian)
        max_hessian = (&(*w))[W_COND];
      if ((&(*w))[W_COND] > 0)
        (&(*w))[W_COND] = 1.f / (&(*w))[W_COND];
    }

  float max_precond = (max_hessian == 0.f) ? 0.f : max_precond_ratio / max_hessian;

  for (typename T::iterator w = weights.begin(); w != weights.end(); ++w)
  {
    if (infpattern(*w) || *w > max_precond)
      (&(*w))[W_COND] = max_precond;
  }
}